

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O0

void __thiscall
Assimp::DeboneProcess::SplitMesh
          (DeboneProcess *this,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
          *poNewMeshes)

{
  allocator<unsigned_int> *this_00;
  uint uVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  reference pvVar5;
  float *pfVar6;
  Logger *this_01;
  reference rVar7;
  bool local_285;
  undefined1 local_1e0 [8];
  pair<aiMesh_*,_const_aiBone_*> push_pair_1;
  aiMesh *subMesh;
  uint f;
  uint j_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subFaces_1;
  uint local_194;
  aiBone *paStack_190;
  uint i_4;
  undefined1 local_188 [8];
  pair<aiMesh_*,_const_aiBone_*> push_pair;
  aiMesh *baseMesh;
  undefined1 local_168 [4];
  uint i_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subFaces;
  uint local_13c;
  undefined1 auStack_138 [4];
  uint i_2;
  _Bit_type local_130;
  reference local_128;
  value_type local_114;
  uint local_110;
  uint w_1;
  uint j_1;
  uint v;
  uint nInterstitial;
  uint i_1;
  undefined1 local_f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> facesPerBone;
  undefined1 local_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> faceBones;
  undefined1 auStack_b8 [4];
  uint nFacesUnowned;
  _Bit_type local_b0;
  reference local_a8;
  uint local_98;
  float local_94;
  uint vid;
  float w;
  uint j;
  uint i;
  uint cCoowned;
  uint cUnowned;
  undefined1 local_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  allocator<bool> local_4a;
  bool local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> isBoneNecessary;
  vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  *poNewMeshes_local;
  aiMesh *pMesh_local;
  DeboneProcess *this_local;
  
  uVar1 = pMesh->mNumBones;
  local_49 = false;
  isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)poNewMeshes;
  std::allocator<bool>::allocator(&local_4a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)uVar1,&local_49,&local_4a);
  std::allocator<bool>::~allocator(&local_4a);
  uVar1 = pMesh->mNumVertices;
  cUnowned = 0xffffffff;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&cCoowned + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,(ulong)uVar1,&cUnowned,
             (allocator<unsigned_int> *)((long)&cCoowned + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&cCoowned + 3));
  i = 0xffffffff;
  j = 0xfffffffe;
  for (w = 0.0; (uint)w < pMesh->mNumBones; w = (float)((int)w + 1)) {
    for (vid = 0; vid < pMesh->mBones[(uint)w]->mNumWeights; vid = vid + 1) {
      local_94 = pMesh->mBones[(uint)w]->mWeights[vid].mWeight;
      if ((local_94 != 0.0) || (NAN(local_94))) {
        local_98 = pMesh->mBones[(uint)w]->mWeights[vid].mVertexId;
        if (this->mThreshold <= local_94) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                              (ulong)local_98);
          fVar2 = w;
          if (*pvVar5 == 0xffffffff) {
            pfVar6 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_78,(ulong)local_98);
            *pfVar6 = fVar2;
          }
          else {
            pfVar6 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_78,(ulong)local_98);
            if (*pfVar6 == w) {
              this_01 = DefaultLogger::get();
              Logger::warn(this_01,"Encountered double entry in bone weights");
            }
            else {
              pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                                  (ulong)local_98);
              *pvVar5 = 0xfffffffe;
            }
          }
        }
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)(uint)w);
        local_a8 = rVar7;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          bVar3 = local_94 < this->mThreshold;
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)(uint)w);
          _auStack_b8 = rVar7;
          std::_Bit_reference::operator=((_Bit_reference *)auStack_b8,bVar3);
        }
      }
    }
  }
  faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uVar1 = pMesh->mNumFaces;
  facesPerBone.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  this_00 = (allocator<unsigned_int> *)
            ((long)&facesPerBone.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,(ulong)uVar1,
             (value_type_conflict1 *)
             ((long)&facesPerBone.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&facesPerBone.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  uVar1 = pMesh->mNumBones;
  i_1 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&nInterstitial + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,(ulong)uVar1,&i_1,
             (allocator<unsigned_int> *)((long)&nInterstitial + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&nInterstitial + 3));
  for (v = 0; v < pMesh->mNumFaces; v = v + 1) {
    j_1 = 1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                        (ulong)*pMesh->mFaces[v].mIndices);
    w_1 = *pvVar5;
    for (local_110 = 1; uVar1 = w_1, local_110 < pMesh->mFaces[v].mNumIndices;
        local_110 = local_110 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                          (ulong)pMesh->mFaces[v].mIndices[local_110]);
      local_114 = *pvVar5;
      if (w_1 == local_114) {
        j_1 = j_1 + 1;
      }
      else {
        if (w_1 < pMesh->mNumBones) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)w_1);
          local_128 = rVar7;
          std::_Bit_reference::operator=(&local_128,true);
        }
        if (local_114 < pMesh->mNumBones) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_114);
          _auStack_138 = rVar7;
          std::_Bit_reference::operator=((_Bit_reference *)auStack_138,true);
        }
      }
    }
    if ((w_1 < pMesh->mNumBones) && (j_1 == pMesh->mFaces[v].mNumIndices)) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,(ulong)v);
      *pvVar5 = uVar1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,(ulong)w_1
                         );
      *pvVar5 = *pvVar5 + 1;
    }
    else {
      faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
  }
  local_13c = 0;
  do {
    if (pMesh->mNumFaces <= local_13c) {
      if (faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_168);
        for (baseMesh._4_4_ = 0; baseMesh._4_4_ < pMesh->mNumFaces;
            baseMesh._4_4_ = baseMesh._4_4_ + 1) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                              (ulong)baseMesh._4_4_);
          if (*pvVar5 == 0xffffffff) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_168,
                       (value_type_conflict1 *)((long)&baseMesh + 4));
          }
        }
        push_pair.second =
             (aiBone *)
             MakeSubmesh(pMesh,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_168,0);
        paStack_190 = (aiBone *)0x0;
        std::pair<aiMesh_*,_const_aiBone_*>::pair<aiMesh_*&,_const_aiBone_*,_true>
                  ((pair<aiMesh_*,_const_aiBone_*> *)local_188,(aiMesh **)&push_pair.second,
                   &stack0xfffffffffffffe70);
        std::
        vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
        ::push_back((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                     *)isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,(value_type *)local_188);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_168);
      }
      for (local_194 = 0; local_194 < pMesh->mNumBones; local_194 = local_194 + 1) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)local_194);
        subFaces_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)rVar7._M_p;
        bVar4 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)
                           &subFaces_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        bVar3 = false;
        if (!bVar4) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                              (ulong)local_194);
          bVar3 = *pvVar5 != 0;
        }
        if (bVar3) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&f);
          for (subMesh._4_4_ = 0; subMesh._4_4_ < pMesh->mNumFaces;
              subMesh._4_4_ = subMesh._4_4_ + 1) {
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                (ulong)subMesh._4_4_);
            if (*pvVar5 == local_194) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&f,
                         (value_type_conflict1 *)((long)&subMesh + 4));
            }
          }
          subMesh._0_4_ = 1;
          push_pair_1.second =
               (aiBone *)
               MakeSubmesh(pMesh,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&f,1);
          ApplyTransform(this,(aiMesh *)push_pair_1.second,&pMesh->mBones[local_194]->mOffsetMatrix)
          ;
          std::pair<aiMesh_*,_const_aiBone_*>::pair<aiMesh_*&,_aiBone_*&,_true>
                    ((pair<aiMesh_*,_const_aiBone_*> *)local_1e0,(aiMesh **)&push_pair_1.second,
                     pMesh->mBones + local_194);
          std::
          vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
          ::push_back((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                       *)isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,(value_type *)local_1e0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&f);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      return;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                        (ulong)local_13c);
    local_285 = false;
    if (*pvVar5 < pMesh->mNumBones) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                          (ulong)local_13c);
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)*pvVar5);
      subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)rVar7._M_p;
      local_285 = std::_Bit_reference::operator_cast_to_bool
                            ((_Bit_reference *)
                             &subFaces.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_285 != false) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                          (ulong)local_13c);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                          (ulong)*pvVar5);
      if (*pvVar5 == 0) {
        __assert_fail("facesPerBone[faceBones[i]]>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/DeboneProcess.cpp"
                      ,0x149,
                      "void Assimp::DeboneProcess::SplitMesh(const aiMesh *, std::vector<std::pair<aiMesh *, const aiBone *>> &) const"
                     );
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                          (ulong)local_13c);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                          (ulong)*pvVar5);
      *pvVar5 = *pvVar5 - 1;
      faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                          (ulong)local_13c);
      *pvVar5 = 0xffffffff;
    }
    local_13c = local_13c + 1;
  } while( true );
}

Assistant:

void DeboneProcess::SplitMesh( const aiMesh* pMesh, std::vector< std::pair< aiMesh*,const aiBone* > >& poNewMeshes) const
{
    // same deal here as ConsiderMesh basically

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;

            if(w>=mThreshold) {
                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }
    }

    unsigned int nFacesUnowned = 0;

    std::vector<unsigned int> faceBones(pMesh->mNumFaces,UINT_MAX);
    std::vector<unsigned int> facesPerBone(pMesh->mNumBones,0);

    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        unsigned int nInterstitial = 1;

        unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

        for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
            unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

            if(v!=w)    {
                if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
            }
            else nInterstitial++;
        }

        if(v<pMesh->mNumBones &&nInterstitial==pMesh->mFaces[i].mNumIndices)    {
            faceBones[i] = v; //primitive belongs to bone #v
            facesPerBone[v]++;
        }
        else nFacesUnowned++;
    }

    // invalidate any "cojoined" faces
    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        if(faceBones[i]<pMesh->mNumBones&&isBoneNecessary[faceBones[i]])
        {
            ai_assert(facesPerBone[faceBones[i]]>0);
            facesPerBone[faceBones[i]]--;

            nFacesUnowned++;
            faceBones[i] = cUnowned;
        }
    }

    if(nFacesUnowned) {
        std::vector<unsigned int> subFaces;

        for(unsigned int i=0;i<pMesh->mNumFaces;i++)    {
            if(faceBones[i]==cUnowned) {
                subFaces.push_back(i);
            }
        }

        aiMesh *baseMesh = MakeSubmesh(pMesh,subFaces,0);
        std::pair<aiMesh*,const aiBone*> push_pair(baseMesh,(const aiBone*)0);

        poNewMeshes.push_back(push_pair);
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++) {

        if(!isBoneNecessary[i]&&facesPerBone[i]>0)  {
            std::vector<unsigned int> subFaces;

            for(unsigned int j=0;j<pMesh->mNumFaces;j++)    {
                if(faceBones[j]==i) {
                    subFaces.push_back(j);
                }
            }

            unsigned int f = AI_SUBMESH_FLAGS_SANS_BONES;
            aiMesh *subMesh =MakeSubmesh(pMesh,subFaces,f);

            //Lifted from PretransformVertices.cpp
            ApplyTransform(subMesh,pMesh->mBones[i]->mOffsetMatrix);
            std::pair<aiMesh*,const aiBone*> push_pair(subMesh,pMesh->mBones[i]);

            poNewMeshes.push_back(push_pair);
        }
    }
}